

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O1

void bloaty::macho::ParseSegment<segment_command_64,section_64>(LoadCommand cmd,RangeSink *sink)

{
  char *__string;
  char *pcVar1;
  string_view name;
  string_view name_00;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  char *pcVar9;
  string_view name_01;
  string_view name_02;
  char *local_90;
  string label;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  
  if (cmd.command_data._M_len < 0x48) {
LAB_00194878:
    Throw("Premature EOF reading Mach-O data.",0x36);
  }
  uVar2 = cmd.command_data._M_len - 0x48;
  __string = cmd.command_data._M_str + 8;
  sVar3 = strnlen(__string,0x10);
  iVar8 = *(int *)(cmd.command_data._M_str + 0x38);
  if (sink->data_source_ == kSections) {
    iVar6 = *(int *)(cmd.command_data._M_str + 0x40);
    if (iVar6 != 0) {
      local_90 = "integer overflow in addition";
      pcVar1 = cmd.command_data._M_str + 0x48;
      do {
        if (uVar2 < 0x50) goto LAB_00194878;
        uVar7 = *(ulong *)(pcVar1 + 0x28);
        if (((byte)pcVar1[0x40] < 0x13) && ((0x41002U >> ((byte)pcVar1[0x40] & 0x1f) & 1) != 0)) {
          uVar7 = 0;
        }
        uVar2 = uVar2 - 0x50;
        local_40 = strnlen(pcVar1,0x10);
        local_50 = sVar3;
        local_48 = __string;
        local_38 = pcVar1;
        absl::strings_internal::
        JoinAlgorithm<std::basic_string_view<char,std::char_traits<char>>const*,void>
                  (&label,(strings_internal *)&local_50,&stack0xffffffffffffffd0,1,",");
        if (iVar8 == 0) {
          uVar4 = (ulong)*(uint *)(pcVar1 + 0x30);
          if (CARRY8(uVar7,uVar4)) goto LAB_00194889;
          if (cmd.file_data._M_len < uVar7 + uVar4) goto LAB_00194825;
          if (cmd.file_data._M_len < uVar4) goto LAB_00194838;
          pcVar5 = cmd.file_data._M_str + uVar4;
          pcVar9 = (sink->file_->data_)._M_str;
          if ((pcVar9 <= pcVar5) && (pcVar5 < pcVar9 + (sink->file_->data_)._M_len)) {
            if (cmd.file_data._M_len - uVar4 < uVar7) {
              uVar7 = cmd.file_data._M_len - uVar4;
            }
            name_02._M_str = label._M_dataplus._M_p;
            name_02._M_len = label._M_string_length;
            RangeSink::AddFileRange(sink,"macho_section",name_02,(long)pcVar5 - (long)pcVar9,uVar7);
          }
        }
        else {
          uVar4 = (ulong)*(uint *)(pcVar1 + 0x30);
          if (CARRY8(uVar7,uVar4)) {
LAB_00194889:
            iVar8 = 0x4b;
LAB_0019488e:
            Throw(local_90,iVar8);
          }
          if (cmd.file_data._M_len < uVar7 + uVar4) {
LAB_00194825:
            iVar8 = 0x5d;
            local_90 = "region out-of-bounds";
            goto LAB_0019488e;
          }
          if (cmd.file_data._M_len < uVar4) {
LAB_00194838:
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",uVar4,cmd.file_data._M_len);
          }
          if (cmd.file_data._M_len - uVar4 < uVar7) {
            uVar7 = cmd.file_data._M_len - uVar4;
          }
          name_01._M_str = label._M_dataplus._M_p;
          name_01._M_len = label._M_string_length;
          RangeSink::AddRange(sink,"macho_section",name_01,*(uint64_t *)(pcVar1 + 0x20),
                              *(uint64_t *)(pcVar1 + 0x28),
                              (uint64_t)
                              (cmd.file_data._M_str + (uVar4 - (long)(sink->file_->data_)._M_str)),
                              uVar7);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)label._M_dataplus._M_p != &label.field_2) {
          operator_delete(label._M_dataplus._M_p,label.field_2._M_allocated_capacity + 1);
        }
        iVar6 = iVar6 + -1;
        pcVar1 = pcVar1 + 0x50;
      } while (iVar6 != 0);
    }
  }
  else {
    if (sink->data_source_ != kSegments) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/macho.cc"
                    ,0x11f,
                    "void bloaty::macho::ParseSegment(LoadCommand, RangeSink *) [Segment = segment_command_64, Section = section_64]"
                   );
    }
    if (iVar8 == 0) {
      uVar2 = *(ulong *)(cmd.command_data._M_str + 0x28);
      uVar7 = *(ulong *)(cmd.command_data._M_str + 0x30);
      if (CARRY8(uVar7,uVar2)) {
LAB_001948e5:
        Throw("integer overflow in addition",0x4b);
      }
      if (cmd.file_data._M_len < uVar7 + uVar2) {
LAB_001948f6:
        Throw("region out-of-bounds",0x5d);
      }
      if (cmd.file_data._M_len < uVar2) {
LAB_00194918:
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar2);
      }
      pcVar9 = cmd.file_data._M_str + uVar2;
      pcVar1 = (sink->file_->data_)._M_str;
      if ((pcVar1 <= pcVar9) && (pcVar9 < pcVar1 + (sink->file_->data_)._M_len)) {
        if (cmd.file_data._M_len - uVar2 < uVar7) {
          uVar7 = cmd.file_data._M_len - uVar2;
        }
        name_00._M_str = __string;
        name_00._M_len = sVar3;
        RangeSink::AddFileRange(sink,"macho_segment",name_00,(long)pcVar9 - (long)pcVar1,uVar7);
        return;
      }
    }
    else {
      uVar2 = *(ulong *)(cmd.command_data._M_str + 0x28);
      uVar7 = *(ulong *)(cmd.command_data._M_str + 0x30);
      if (CARRY8(uVar7,uVar2)) goto LAB_001948e5;
      if (cmd.file_data._M_len < uVar7 + uVar2) goto LAB_001948f6;
      if (cmd.file_data._M_len < uVar2) goto LAB_00194918;
      if (cmd.file_data._M_len - uVar2 < uVar7) {
        uVar7 = cmd.file_data._M_len - uVar2;
      }
      name._M_str = __string;
      name._M_len = sVar3;
      RangeSink::AddRange(sink,"macho_segment",name,*(uint64_t *)(cmd.command_data._M_str + 0x18),
                          *(uint64_t *)(cmd.command_data._M_str + 0x20),
                          (uint64_t)
                          (cmd.file_data._M_str + (uVar2 - (long)(sink->file_->data_)._M_str)),uVar7
                         );
    }
  }
  return;
}

Assistant:

const T* GetStructPointerAndAdvance(string_view* data) {
  const T* ret = GetStructPointer<T>(*data);
  *data = data->substr(sizeof(T));
  return ret;
}